

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O2

void __thiscall
ON_ClassId::ConstructorHelper(ON_ClassId *this,char *sClassName,char *sBaseClassName,char *sUUID)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ON_ClassId *pOVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  ON_ClassId **ppOVar9;
  long lVar10;
  ON_UUID OVar11;
  uchar in_stack_ffffffffffffffa8 [8];
  char local_4f [6];
  undefined1 local_49;
  char local_48 [16];
  ON_ClassId *local_38;
  
  pcVar5 = this->m_sClassName;
  memset(pcVar5,0,0xa0);
  OVar11 = ON_UuidFromString(sUUID);
  this->m_uuid = OVar11;
  if (sClassName != (char *)0x0) {
    strncpy(pcVar5,sClassName,0x4f);
  }
  if (sBaseClassName != (char *)0x0) {
    strncpy(this->m_sBaseClassName,sBaseClassName,0x4f);
  }
  pOVar4 = ClassId(this->m_sBaseClassName);
  this->m_pBaseClassId = pOVar4;
  if (this->m_sClassName[0] == '\0') {
    pcVar5 = "ON_ClassId::ON_ClassId() - missing class name";
    iVar3 = 0x2e2;
  }
  else {
    pOVar4 = ClassId(pcVar5);
    if ((pOVar4 != (ON_ClassId *)0x0) && (2 < m_mark0)) {
      local_38 = this;
      ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x2ee,"",
                   "ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique."
                  );
      uVar8 = 1;
      while ((uVar7 = (uint)uVar8, this = local_38, uVar7 < 10000 && (pOVar4 != (ON_ClassId *)0x0)))
      {
        builtin_strncpy(local_48,"0123456789",10);
        lVar10 = 5;
        while( true ) {
          iVar3 = (int)uVar8;
          if (lVar10 == 0) break;
          uVar8 = (long)iVar3 / 10;
          uVar1 = (long)iVar3 % 10;
          if ((int)uVar1 < 0) {
            cVar6 = '-';
          }
          else {
            cVar6 = local_48[uVar1 & 0xffffffff];
          }
          local_4f[lVar10] = cVar6;
          lVar10 = lVar10 + -1;
        }
        local_4f[0] = '-';
        local_49 = 0;
        strncpy(pcVar5,sClassName,0x4f);
        strncat(pcVar5,local_4f,0x4f);
        pOVar4 = ClassId(pcVar5);
        uVar8 = (ulong)(uVar7 + 1);
      }
    }
    if (pOVar4 == (ON_ClassId *)0x0) {
      if (((*(long *)this->m_sClassName == 0x63656a624f5f4e4f && this->m_sClassName[8] == 't') &&
           this->m_sClassName[9] == '\0') || (this->m_sBaseClassName[0] != '\0')) {
        g_bDisableDemotion = 1;
        OVar11.Data4[0] = in_stack_ffffffffffffffa8[0];
        OVar11.Data4[1] = in_stack_ffffffffffffffa8[1];
        OVar11.Data4[2] = in_stack_ffffffffffffffa8[2];
        OVar11.Data4[3] = in_stack_ffffffffffffffa8[3];
        OVar11.Data4[4] = in_stack_ffffffffffffffa8[4];
        OVar11.Data4[5] = in_stack_ffffffffffffffa8[5];
        OVar11.Data4[6] = in_stack_ffffffffffffffa8[6];
        OVar11.Data4[7] = in_stack_ffffffffffffffa8[7];
        OVar11.Data1 = 0x562fa0;
        OVar11.Data2 = 0;
        OVar11.Data3 = 0;
        pOVar4 = ClassId(OVar11);
        g_bDisableDemotion = 0;
        if (pOVar4 == (ON_ClassId *)0x0) {
          bVar2 = ON_UuidIsNil(&this->m_uuid);
          if (!bVar2) {
            if (*pcVar5 != '\0') {
              ppOVar9 = &m_p0;
              while (ppOVar9 = &((ON_ClassId *)ppOVar9)->m_pNext->m_pNext,
                    (ON_ClassId *)ppOVar9 != (ON_ClassId *)0x0) {
                if ((((((ON_ClassId *)ppOVar9)->m_pBaseClassId == (ON_ClassId *)0x0) &&
                     (((ON_ClassId *)ppOVar9)->m_sBaseClassName[0] != '\0')) &&
                    (((ON_ClassId *)ppOVar9)->m_sBaseClassName[0x4f] == '\0')) &&
                   (iVar3 = strcmp(pcVar5,((ON_ClassId *)ppOVar9)->m_sBaseClassName), iVar3 == 0)) {
                  ((ON_ClassId *)ppOVar9)->m_pBaseClassId = this;
                }
              }
            }
            ppOVar9 = &m_p1->m_pNext;
            if (m_p1 == (ON_ClassId *)0x0) {
              ppOVar9 = &m_p0;
            }
            if (m_p0 == (ON_ClassId *)0x0) {
              ppOVar9 = &m_p0;
            }
            ((ON_ClassId *)ppOVar9)->m_pNext = this;
            m_p1 = this;
            this->m_pNext = (ON_ClassId *)0x0;
            return;
          }
          pcVar5 = "ON_ClassId::ON_ClassId() - class uuid is nill.";
          iVar3 = 0x31b;
        }
        else {
          pcVar5 = "ON_ClassId::ON_ClassId() - class uuid already in use.";
          iVar3 = 0x315;
        }
      }
      else {
        pcVar5 = "ON_ClassId::ON_ClassId() - missing baseclass name.";
        iVar3 = 0x30c;
      }
    }
    else {
      pcVar5 = "ON_ClassId::ON_ClassId() - class name already in use.";
      iVar3 = 0x2fc;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
             ,iVar3,"",pcVar5);
  return;
}

Assistant:

void ON_ClassId::ConstructorHelper( const char* sClassName, 
                        const char* sBaseClassName, 
                        const char* sUUID // UUID in registry format from guidgen
                        ) 
{
  // Do not initialize "m_class_id_version" or any fields
  // after it in this helper.  See comments in the constructors
  // for more information.
  memset( m_sClassName, 0, sizeof(m_sClassName) );
  memset( m_sBaseClassName, 0, sizeof(m_sBaseClassName) );
  m_uuid = ON_UuidFromString(sUUID);
  if ( sClassName ) {
    strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
  }
  if ( sBaseClassName ) {
    strncpy( m_sBaseClassName, sBaseClassName, sizeof(m_sBaseClassName)-1 );
  }
  m_pBaseClassId = ClassId( m_sBaseClassName );

  if ( !m_sClassName[0] ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - missing class name");
    return;
  }

  const ON_ClassId* duplicate_class = ClassId( m_sClassName );
  // The m_mark0 > 2 test prevents opennurbs and Rhino from
  // having two ON_Object derived classes that have the same
  // name.  Plug-ins are free to use any name.
  if ( 0 != duplicate_class && m_mark0 > 2 )
  {
    char s[7];
    int ver;
    ON_WARNING("ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique.");
    for ( ver = 1; ver < 10000 && 0 != duplicate_class; ver++ )
    {
      IntToString(ver,s);
      s[6] = 0;
      strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
      strncat( m_sClassName, s, sizeof(m_sClassName)-1 );
      duplicate_class = ClassId( m_sClassName );
    }
  }

  if ( 0 != duplicate_class )
  {
    // Do NOT permit core classes to have duplicate names.
    ON_ERROR("ON_ClassId::ON_ClassId() - class name already in use.");
    return;
  }

  if (    m_sClassName[0] != 'O'
       || m_sClassName[1] != 'N'
       || m_sClassName[2] != '_'
       || m_sClassName[3] != 'O'
       || m_sClassName[4] != 'b'
       || m_sClassName[5] != 'j'
       || m_sClassName[6] != 'e'
       || m_sClassName[7] != 'c'
       || m_sClassName[8] != 't'
       || m_sClassName[9] != 0 ) {
    if ( !m_sBaseClassName[0] ) 
    {
      ON_ERROR("ON_ClassId::ON_ClassId() - missing baseclass name.");
      return;
    }
  }

  g_bDisableDemotion = true;
  if ( ClassId( m_uuid ) ) 
  {
    g_bDisableDemotion = false;
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid already in use.");
    return;
  }
  g_bDisableDemotion = false;

  if ( ON_UuidIsNil( m_uuid ) ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid is nill.");
    return;
  }

  // see if any derived classes need to be updated because their static
  // members got initialized first
  if ( m_sClassName[0] ) 
  {
    for ( ON_ClassId* p = m_p0; p; p = p->m_pNext )
    {
      if ( 
        0 == p->m_pBaseClassId 
        && 0 != p->m_sBaseClassName[0] 
        && 0 == p->m_sBaseClassName[sizeof(p->m_sBaseClassName)/sizeof(p->m_sBaseClassName[0]) - 1] 
        )
      {
        if ( 0 == strcmp( m_sClassName, p->m_sBaseClassName ) )
          p->m_pBaseClassId = this;
      }
    }
  }

  // Append to the list of class ids
  if ( m_p0 && m_p1 )
  {
    m_p1->m_pNext = this;
    m_p1 = this;
  }
  else
  {
    // first class id
    m_p0 = this;
  }
  m_p1 = this;
  m_p1->m_pNext = 0;
}